

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.h
# Opt level: O1

void __thiscall
xmrig::SelfSelectClient::onClose(SelfSelectClient *this,IClient *param_1,int failures)

{
  (*this->m_listener->_vptr_IClientListener[2])(this->m_listener,this);
  if (this->m_state != IdleState) {
    this->m_timestamp = 0;
    this->m_failures = 0;
    this->m_state = IdleState;
  }
  this->m_active = false;
  return;
}

Assistant:

inline void onClose(IClient *, int failures) override                                           { m_listener->onClose(this, failures); setState(IdleState); m_active = false; }